

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void jpeg_new_colormap(j_decompress_ptr cinfo)

{
  long lVar1;
  long *in_RDI;
  my_master_ptr_conflict master;
  
  lVar1 = in_RDI[0x44];
  if (*(int *)((long)in_RDI + 0x24) != 0xcf) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if (((*(int *)((long)in_RDI + 0x6c) == 0) || ((int)in_RDI[0x10] == 0)) || (in_RDI[0x14] == 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2e;
    (**(code **)*in_RDI)(in_RDI);
  }
  else {
    in_RDI[0x4e] = *(long *)(lVar1 + 0x88);
    (**(code **)(in_RDI[0x4e] + 0x18))(in_RDI);
    *(undefined4 *)(lVar1 + 0x10) = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_new_colormap(j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr)cinfo->master;

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_BUFIMAGE)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (cinfo->quantize_colors && cinfo->enable_external_quant &&
      cinfo->colormap != NULL) {
    /* Select 2-pass quantizer for external colormap use */
    cinfo->cquantize = master->quantizer_2pass;
    /* Notify quantizer of colormap change */
    (*cinfo->cquantize->new_color_map) (cinfo);
    master->pub.is_dummy_pass = FALSE; /* just in case */
  } else
    ERREXIT(cinfo, JERR_MODE_CHANGE);
}